

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

int Ssw_StrSimMatchingCountUnmached(Aig_Man_t *p)

{
  void *pvVar1;
  uint uVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar1 != (void *)0x0) &&
       ((uVar2 = *(uint *)((long)pvVar1 + 0x18) & 7, uVar2 == 2 || (uVar2 - 5 < 2)))) {
      uVar2 = 1;
      if (p->pReprs != (Aig_Obj_t **)0x0) {
        uVar2 = (uint)(p->pReprs[*(int *)((long)pvVar1 + 0x24)] == (Aig_Obj_t *)0x0);
      }
      iVar3 = iVar3 + uVar2;
    }
  }
  return iVar3;
}

Assistant:

int Ssw_StrSimMatchingCountUnmached( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Aig_ObjRepr( p, pObj ) != NULL )
            continue;
        Counter++;
    }
    return Counter;
}